

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Connection *c)

{
  Expression *pEVar1;
  pool_ptr<soul::AST::Constant> cv;
  long local_10;
  
  ASTVisitor::visit(&this->super_ASTVisitor,c);
  pEVar1 = (c->delayLength).object;
  if (pEVar1 != (Expression *)0x0) {
    throwErrorIfNotReadableValue(pEVar1);
    pEVar1 = (c->delayLength).object;
    if (pEVar1 == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_10);
    if (local_10 != 0) {
      checkDelayLineLength((Context *)(local_10 + 0x10),(Value *)(local_10 + 0x30));
    }
  }
  return;
}

Assistant:

void visit (AST::Connection& c) override
        {
            super::visit (c);

            if (c.delayLength != nullptr)
            {
                throwErrorIfNotReadableValue (*c.delayLength);

                if (auto cv = c.delayLength->getAsConstant())
                    checkDelayLineLength (cv->context, cv->value);
            }
        }